

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftplistparser.c
# Opt level: O0

size_t Curl_ftp_parselist(char *buffer,size_t size,size_t nmemb,void *connptr)

{
  curlfiletype cVar1;
  size_t sVar2;
  bool bVar3;
  int iVar4;
  fileinfo *pfVar5;
  void *pvVar6;
  ushort **ppuVar7;
  char *pcVar8;
  long lVar9;
  int *piVar10;
  undefined4 uVar11;
  char *local_b0;
  char *endptr_1;
  curl_off_t fsize;
  char *p_1;
  long hlinks;
  char *p;
  byte *pbStack_80;
  uint perm;
  char *endptr;
  char *tmp;
  char c;
  connectdata *pcStack_68;
  CURLcode result;
  unsigned_long i;
  curl_fileinfo *finfo;
  fileinfo *infop;
  ftp_parselist_data *parser;
  ftp_wc_tmpdata *tmpdata;
  connectdata *conn;
  size_t bufflen;
  void *connptr_local;
  size_t nmemb_local;
  size_t size_local;
  char *buffer_local;
  
  conn = (connectdata *)(size * nmemb);
  parser = *(ftp_parselist_data **)(*connptr + 0x4f48);
  infop = *(fileinfo **)parser;
  pcStack_68 = (connectdata *)0x0;
  buffer_local = (char *)conn;
  if (*(int *)&(infop->info).field_0xc == 0) {
    tmpdata = (ftp_wc_tmpdata *)connptr;
    bufflen = (size_t)connptr;
    connptr_local = (void *)nmemb;
    nmemb_local = size;
    size_local = (size_t)buffer;
    if ((*(int *)&(infop->info).filename == 0) && (conn != (connectdata *)0x0)) {
      bVar3 = false;
      if ('/' < *buffer) {
        bVar3 = *buffer < ':';
      }
      uVar11 = 1;
      if (bVar3) {
        uVar11 = 2;
      }
      *(undefined4 *)&(infop->info).filename = uVar11;
    }
    for (; pcStack_68 < conn; pcStack_68 = (connectdata *)((long)&pcStack_68->data + 1)) {
      tmp._3_1_ = (pcStack_68->chunk).hexbuffer[size_local - 0x20];
      if ((infop->info).time == 0) {
        pfVar5 = Curl_fileinfo_alloc();
        (infop->info).time = (time_t)pfVar5;
        if ((infop->info).time == 0) {
          *(undefined4 *)&(infop->info).field_0xc = 0x1b;
          return (size_t)conn;
        }
        pvVar6 = (*Curl_cmalloc)(0xa0);
        *(void **)((infop->info).time + 0x68) = pvVar6;
        if (*(long *)((infop->info).time + 0x68) == 0) {
          PL_ERROR((connectdata *)tmpdata,CURLE_OUT_OF_MEMORY);
          return (size_t)conn;
        }
        *(undefined8 *)((infop->info).time + 0x70) = 0xa0;
        *(undefined8 *)&(infop->info).gid = 0;
        (infop->info).perm = 0;
      }
      i = (infop->info).time;
      sVar2 = ((curl_fileinfo *)i)->b_used;
      ((curl_fileinfo *)i)->b_used = sVar2 + 1;
      ((curl_fileinfo *)i)->b_data[sVar2] = tmp._3_1_;
      finfo = (curl_fileinfo *)i;
      if (((curl_fileinfo *)i)->b_size - 1 <= ((curl_fileinfo *)i)->b_used) {
        endptr = (char *)(*Curl_crealloc)(((curl_fileinfo *)i)->b_data,
                                          ((curl_fileinfo *)i)->b_size + 0xa0);
        if (endptr == (char *)0x0) {
          Curl_fileinfo_dtor((void *)0x0,(void *)(infop->info).time);
          (infop->info).time = 0;
          *(undefined4 *)&(infop->info).field_0xc = 0x1b;
          PL_ERROR((connectdata *)tmpdata,CURLE_OUT_OF_MEMORY);
          return (size_t)conn;
        }
        *(long *)(i + 0x70) = *(long *)(i + 0x70) + 0xa0;
        *(char **)(i + 0x68) = endptr;
      }
      iVar4 = *(int *)&(infop->info).filename;
      if (iVar4 == 1) {
        switch(*(undefined4 *)((long)&(infop->info).filename + 4)) {
        case 0:
          cVar1 = (infop->info).filetype;
          if (cVar1 == CURLFILETYPE_FILE) {
            if (tmp._3_1_ == 0x74) {
              (infop->info).filetype = CURLFILETYPE_DIRECTORY;
              (infop->info).perm = (infop->info).perm + 1;
            }
            else {
              *(undefined4 *)((long)&(infop->info).filename + 4) = 1;
              *(undefined8 *)(i + 0x78) = 0;
              pcStack_68 = (connectdata *)((long)&pcStack_68[-1].connect_buffer + 7);
            }
          }
          else if (cVar1 == CURLFILETYPE_DIRECTORY) {
            (infop->info).perm = (infop->info).perm + 1;
            if (tmp._3_1_ == 0xd) {
              (infop->info).perm = (infop->info).perm - 1;
              *(long *)(i + 0x78) = *(long *)(i + 0x78) + -1;
            }
            else if (tmp._3_1_ == 10) {
              *(undefined1 *)(*(long *)(i + 0x68) + (ulong)((infop->info).perm - 1)) = 0;
              iVar4 = strncmp("total ",*(char **)(i + 0x68),6);
              if (iVar4 != 0) {
                PL_ERROR((connectdata *)tmpdata,CURLE_FTP_BAD_FILE_LIST);
                return (size_t)conn;
              }
              pbStack_80 = (byte *)(*(long *)(i + 0x68) + 6);
              while (ppuVar7 = __ctype_b_loc(), ((*ppuVar7)[(int)(uint)*pbStack_80] & 0x2000) != 0)
              {
                pbStack_80 = pbStack_80 + 1;
              }
              while (ppuVar7 = __ctype_b_loc(), ((*ppuVar7)[(int)(uint)*pbStack_80] & 0x800) != 0) {
                pbStack_80 = pbStack_80 + 1;
              }
              if (*pbStack_80 != 0) {
                PL_ERROR((connectdata *)tmpdata,CURLE_FTP_BAD_FILE_LIST);
                return (size_t)conn;
              }
              *(undefined4 *)((long)&(infop->info).filename + 4) = 1;
              *(undefined8 *)(i + 0x78) = 0;
            }
          }
          break;
        case 1:
          switch(tmp._3_1_) {
          case 0x2d:
            *(undefined4 *)(i + 8) = 0;
            break;
          default:
            PL_ERROR((connectdata *)tmpdata,CURLE_FTP_BAD_FILE_LIST);
            return (size_t)conn;
          case 0x44:
            *(undefined4 *)(i + 8) = 7;
            break;
          case 0x62:
            *(undefined4 *)(i + 8) = 3;
            break;
          case 99:
            *(undefined4 *)(i + 8) = 4;
            break;
          case 100:
            *(undefined4 *)(i + 8) = 1;
            break;
          case 0x6c:
            *(undefined4 *)(i + 8) = 2;
            break;
          case 0x70:
            *(undefined4 *)(i + 8) = 5;
            break;
          case 0x73:
            *(undefined4 *)(i + 8) = 6;
          }
          *(undefined4 *)((long)&(infop->info).filename + 4) = 2;
          (infop->info).perm = 0;
          *(undefined8 *)&(infop->info).gid = 1;
          break;
        case 2:
          (infop->info).perm = (infop->info).perm + 1;
          if ((infop->info).perm < 10) {
            pcVar8 = strchr("rwx-tTsS",(int)(char)tmp._3_1_);
            if (pcVar8 == (char *)0x0) {
              PL_ERROR((connectdata *)tmpdata,CURLE_FTP_BAD_FILE_LIST);
              return (size_t)conn;
            }
          }
          else if ((infop->info).perm == 10) {
            if (tmp._3_1_ != 0x20) {
              PL_ERROR((connectdata *)tmpdata,CURLE_FTP_BAD_FILE_LIST);
              return (size_t)conn;
            }
            *(undefined1 *)(*(long *)(i + 0x68) + 10) = 0;
            p._4_4_ = ftp_pl_get_permission
                                ((char *)(*(long *)(i + 0x68) + *(long *)&(infop->info).gid));
            if ((p._4_4_ & 0x1000000) != 0) {
              PL_ERROR((connectdata *)tmpdata,CURLE_FTP_BAD_FILE_LIST);
              return (size_t)conn;
            }
            lVar9 = (infop->info).time;
            *(uint *)(lVar9 + 0x60) = *(uint *)(lVar9 + 0x60) | 8;
            *(uint *)((infop->info).time + 0x18) = p._4_4_;
            (infop->info).strings.user = *(char **)&(infop->info).gid;
            (infop->info).perm = 0;
            *(undefined4 *)((long)&(infop->info).filename + 4) = 3;
            (infop->info).filetype = CURLFILETYPE_FILE;
          }
          break;
        case 3:
          cVar1 = (infop->info).filetype;
          if (cVar1 == CURLFILETYPE_FILE) {
            if (tmp._3_1_ != 0x20) {
              if (((char)tmp._3_1_ < '0') || ('9' < (char)tmp._3_1_)) {
                PL_ERROR((connectdata *)tmpdata,CURLE_FTP_BAD_FILE_LIST);
                return (size_t)conn;
              }
              *(long *)&(infop->info).gid = *(long *)(i + 0x78) + -1;
              (infop->info).perm = 1;
              (infop->info).filetype = CURLFILETYPE_DIRECTORY;
            }
          }
          else if (cVar1 == CURLFILETYPE_DIRECTORY) {
            (infop->info).perm = (infop->info).perm + 1;
            if (tmp._3_1_ == 0x20) {
              *(undefined1 *)
               (*(long *)(i + 0x68) + *(long *)&(infop->info).gid + (ulong)(infop->info).perm + -1)
                   = 0;
              p_1 = (char *)strtol((char *)(*(long *)(i + 0x68) + *(long *)&(infop->info).gid),
                                   (char **)&hlinks,10);
              if (((*(char *)hlinks == '\0') && (p_1 != (char *)0x7fffffffffffffff)) &&
                 (p_1 != (char *)0x8000000000000000)) {
                lVar9 = (infop->info).time;
                *(uint *)(lVar9 + 0x60) = *(uint *)(lVar9 + 0x60) | 0x80;
                *(char **)((infop->info).time + 0x30) = p_1;
              }
              (infop->info).perm = 0;
              *(undefined8 *)&(infop->info).gid = 0;
              *(undefined4 *)((long)&(infop->info).filename + 4) = 4;
              (infop->info).filetype = CURLFILETYPE_FILE;
            }
            else if (((char)tmp._3_1_ < '0') || ('9' < (char)tmp._3_1_)) {
              PL_ERROR((connectdata *)tmpdata,CURLE_FTP_BAD_FILE_LIST);
              return (size_t)conn;
            }
          }
          break;
        case 4:
          cVar1 = (infop->info).filetype;
          if (cVar1 == CURLFILETYPE_FILE) {
            if (tmp._3_1_ != 0x20) {
              *(long *)&(infop->info).gid = *(long *)(i + 0x78) + -1;
              (infop->info).perm = 1;
              (infop->info).filetype = CURLFILETYPE_DIRECTORY;
            }
          }
          else if ((cVar1 == CURLFILETYPE_DIRECTORY) &&
                  ((infop->info).perm = (infop->info).perm + 1, tmp._3_1_ == 0x20)) {
            *(undefined1 *)
             (*(long *)(i + 0x68) + *(long *)&(infop->info).gid + (ulong)(infop->info).perm + -1) =
                 0;
            (infop->info).hardlinks = *(long *)&(infop->info).gid;
            *(undefined4 *)((long)&(infop->info).filename + 4) = 5;
            (infop->info).filetype = CURLFILETYPE_FILE;
            *(undefined8 *)&(infop->info).gid = 0;
            (infop->info).perm = 0;
          }
          break;
        case 5:
          cVar1 = (infop->info).filetype;
          if (cVar1 == CURLFILETYPE_FILE) {
            if (tmp._3_1_ != 0x20) {
              *(long *)&(infop->info).gid = *(long *)(i + 0x78) + -1;
              (infop->info).perm = 1;
              (infop->info).filetype = CURLFILETYPE_DIRECTORY;
            }
          }
          else if ((cVar1 == CURLFILETYPE_DIRECTORY) &&
                  ((infop->info).perm = (infop->info).perm + 1, tmp._3_1_ == 0x20)) {
            *(undefined1 *)
             (*(long *)(i + 0x68) + *(long *)&(infop->info).gid + (ulong)(infop->info).perm + -1) =
                 0;
            (infop->info).strings.time = *(char **)&(infop->info).gid;
            *(undefined4 *)((long)&(infop->info).filename + 4) = 6;
            (infop->info).filetype = CURLFILETYPE_FILE;
            *(undefined8 *)&(infop->info).gid = 0;
            (infop->info).perm = 0;
          }
          break;
        case 6:
          cVar1 = (infop->info).filetype;
          if (cVar1 == CURLFILETYPE_FILE) {
            if (tmp._3_1_ != 0x20) {
              if (((char)tmp._3_1_ < '0') || ('9' < (char)tmp._3_1_)) {
                PL_ERROR((connectdata *)tmpdata,CURLE_FTP_BAD_FILE_LIST);
                return (size_t)conn;
              }
              *(long *)&(infop->info).gid = *(long *)(i + 0x78) + -1;
              (infop->info).perm = 1;
              (infop->info).filetype = CURLFILETYPE_DIRECTORY;
            }
          }
          else if (cVar1 == CURLFILETYPE_DIRECTORY) {
            (infop->info).perm = (infop->info).perm + 1;
            if (tmp._3_1_ == 0x20) {
              *(undefined1 *)
               (*(long *)(i + 0x68) + *(long *)&(infop->info).gid + (ulong)(infop->info).perm + -1)
                   = 0;
              endptr_1 = (char *)strtol((char *)(*(long *)(i + 0x68) + *(long *)&(infop->info).gid),
                                        (char **)&fsize,10);
              if (((*(char *)fsize == '\0') && (endptr_1 != (char *)0x7fffffffffffffff)) &&
                 (endptr_1 != (char *)0x8000000000000000)) {
                lVar9 = (infop->info).time;
                *(uint *)(lVar9 + 0x60) = *(uint *)(lVar9 + 0x60) | 0x40;
                *(char **)((infop->info).time + 0x28) = endptr_1;
              }
              (infop->info).perm = 0;
              *(undefined8 *)&(infop->info).gid = 0;
              *(undefined4 *)((long)&(infop->info).filename + 4) = 7;
              (infop->info).filetype = CURLFILETYPE_FILE;
            }
            else {
              ppuVar7 = __ctype_b_loc();
              if (((*ppuVar7)[(int)(uint)tmp._3_1_] & 0x800) == 0) {
                PL_ERROR((connectdata *)tmpdata,CURLE_FTP_BAD_FILE_LIST);
                return (size_t)conn;
              }
            }
          }
          break;
        case 7:
          switch((infop->info).filetype) {
          case CURLFILETYPE_FILE:
            if (tmp._3_1_ != 0x20) {
              ppuVar7 = __ctype_b_loc();
              if (((*ppuVar7)[(int)(uint)tmp._3_1_] & 8) == 0) {
                PL_ERROR((connectdata *)tmpdata,CURLE_FTP_BAD_FILE_LIST);
                return (size_t)conn;
              }
              *(long *)&(infop->info).gid = *(long *)(i + 0x78) + -1;
              (infop->info).perm = 1;
              (infop->info).filetype = CURLFILETYPE_DIRECTORY;
            }
            break;
          case CURLFILETYPE_DIRECTORY:
            (infop->info).perm = (infop->info).perm + 1;
            if (tmp._3_1_ == 0x20) {
              (infop->info).filetype = CURLFILETYPE_SYMLINK;
            }
            else {
              ppuVar7 = __ctype_b_loc();
              if ((((*ppuVar7)[(int)(uint)tmp._3_1_] & 8) == 0) && (tmp._3_1_ != 0x2e)) {
                PL_ERROR((connectdata *)tmpdata,CURLE_FTP_BAD_FILE_LIST);
                return (size_t)conn;
              }
            }
            break;
          case CURLFILETYPE_SYMLINK:
            (infop->info).perm = (infop->info).perm + 1;
            if (tmp._3_1_ != 0x20) {
              ppuVar7 = __ctype_b_loc();
              if (((*ppuVar7)[(int)(uint)tmp._3_1_] & 8) == 0) {
                PL_ERROR((connectdata *)tmpdata,CURLE_FTP_BAD_FILE_LIST);
                return (size_t)conn;
              }
              (infop->info).filetype = CURLFILETYPE_DEVICE_BLOCK;
            }
            break;
          case CURLFILETYPE_DEVICE_BLOCK:
            (infop->info).perm = (infop->info).perm + 1;
            if (tmp._3_1_ == 0x20) {
              (infop->info).filetype = CURLFILETYPE_DEVICE_CHAR;
            }
            else {
              ppuVar7 = __ctype_b_loc();
              if ((((*ppuVar7)[(int)(uint)tmp._3_1_] & 8) == 0) && (tmp._3_1_ != 0x2e)) {
                PL_ERROR((connectdata *)tmpdata,CURLE_FTP_BAD_FILE_LIST);
                return (size_t)conn;
              }
            }
            break;
          case CURLFILETYPE_DEVICE_CHAR:
            (infop->info).perm = (infop->info).perm + 1;
            if (tmp._3_1_ != 0x20) {
              ppuVar7 = __ctype_b_loc();
              if (((*ppuVar7)[(int)(uint)tmp._3_1_] & 8) == 0) {
                PL_ERROR((connectdata *)tmpdata,CURLE_FTP_BAD_FILE_LIST);
                return (size_t)conn;
              }
              (infop->info).filetype = CURLFILETYPE_NAMEDPIPE;
            }
            break;
          case CURLFILETYPE_NAMEDPIPE:
            (infop->info).perm = (infop->info).perm + 1;
            if (tmp._3_1_ == 0x20) {
              *(undefined1 *)
               (*(long *)(i + 0x68) + *(long *)&(infop->info).gid + (ulong)(infop->info).perm + -1)
                   = 0;
              (infop->info).strings.perm = *(char **)&(infop->info).gid;
              if (*(int *)(i + 8) == 2) {
                *(undefined4 *)((long)&(infop->info).filename + 4) = 9;
                (infop->info).filetype = CURLFILETYPE_FILE;
              }
              else {
                *(undefined4 *)((long)&(infop->info).filename + 4) = 8;
                (infop->info).filetype = CURLFILETYPE_FILE;
              }
            }
            else {
              ppuVar7 = __ctype_b_loc();
              if (((((*ppuVar7)[(int)(uint)tmp._3_1_] & 8) == 0) && (tmp._3_1_ != 0x2e)) &&
                 (tmp._3_1_ != 0x3a)) {
                PL_ERROR((connectdata *)tmpdata,CURLE_FTP_BAD_FILE_LIST);
                return (size_t)conn;
              }
            }
          }
          break;
        case 8:
          cVar1 = (infop->info).filetype;
          if (cVar1 == CURLFILETYPE_FILE) {
            if (tmp._3_1_ != 0x20) {
              *(long *)&(infop->info).gid = *(long *)(i + 0x78) + -1;
              (infop->info).perm = 1;
              (infop->info).filetype = CURLFILETYPE_DIRECTORY;
            }
          }
          else if (cVar1 == CURLFILETYPE_DIRECTORY) {
            (infop->info).perm = (infop->info).perm + 1;
            if (tmp._3_1_ == 0xd) {
              (infop->info).filetype = CURLFILETYPE_SYMLINK;
            }
            else if (tmp._3_1_ == 10) {
              *(undefined1 *)
               (*(long *)(i + 0x68) + *(long *)&(infop->info).gid + (ulong)(infop->info).perm + -1)
                   = 0;
              (infop->info).size = *(curl_off_t *)&(infop->info).gid;
              *(undefined4 *)((long)&(infop->info).filename + 4) = 1;
              tmp._4_4_ = ftp_pl_insert_finfo((connectdata *)tmpdata,(fileinfo *)finfo);
              if (tmp._4_4_ != CURLE_OK) {
                PL_ERROR((connectdata *)tmpdata,tmp._4_4_);
                return (size_t)conn;
              }
              tmp._4_4_ = 0;
            }
          }
          else if (cVar1 == CURLFILETYPE_SYMLINK) {
            if (tmp._3_1_ != 10) {
              PL_ERROR((connectdata *)tmpdata,CURLE_FTP_BAD_FILE_LIST);
              return (size_t)conn;
            }
            *(undefined1 *)
             (*(long *)(i + 0x68) + *(long *)&(infop->info).gid + (ulong)(infop->info).perm + -1) =
                 0;
            (infop->info).size = *(curl_off_t *)&(infop->info).gid;
            *(undefined4 *)((long)&(infop->info).filename + 4) = 1;
            tmp._4_4_ = ftp_pl_insert_finfo((connectdata *)tmpdata,(fileinfo *)finfo);
            if (tmp._4_4_ != CURLE_OK) {
              PL_ERROR((connectdata *)tmpdata,tmp._4_4_);
              return (size_t)conn;
            }
            tmp._4_4_ = 0;
          }
          break;
        case 9:
          switch((infop->info).filetype) {
          case CURLFILETYPE_FILE:
            if (tmp._3_1_ != 0x20) {
              *(long *)&(infop->info).gid = *(long *)(i + 0x78) + -1;
              (infop->info).perm = 1;
              (infop->info).filetype = CURLFILETYPE_DIRECTORY;
            }
            break;
          case CURLFILETYPE_DIRECTORY:
            (infop->info).perm = (infop->info).perm + 1;
            if (tmp._3_1_ == 0x20) {
              (infop->info).filetype = CURLFILETYPE_SYMLINK;
            }
            else if ((tmp._3_1_ == 0xd) || (tmp._3_1_ == 10)) {
              PL_ERROR((connectdata *)tmpdata,CURLE_FTP_BAD_FILE_LIST);
              return (size_t)conn;
            }
            break;
          case CURLFILETYPE_SYMLINK:
            (infop->info).perm = (infop->info).perm + 1;
            if (tmp._3_1_ == 0x2d) {
              (infop->info).filetype = CURLFILETYPE_DEVICE_BLOCK;
            }
            else {
              if ((tmp._3_1_ == 0xd) || (tmp._3_1_ == 10)) {
                PL_ERROR((connectdata *)tmpdata,CURLE_FTP_BAD_FILE_LIST);
                return (size_t)conn;
              }
              (infop->info).filetype = CURLFILETYPE_DIRECTORY;
            }
            break;
          case CURLFILETYPE_DEVICE_BLOCK:
            (infop->info).perm = (infop->info).perm + 1;
            if (tmp._3_1_ == 0x3e) {
              (infop->info).filetype = CURLFILETYPE_DEVICE_CHAR;
            }
            else {
              if ((tmp._3_1_ == 0xd) || (tmp._3_1_ == 10)) {
                PL_ERROR((connectdata *)tmpdata,CURLE_FTP_BAD_FILE_LIST);
                return (size_t)conn;
              }
              (infop->info).filetype = CURLFILETYPE_DIRECTORY;
            }
            break;
          case CURLFILETYPE_DEVICE_CHAR:
            (infop->info).perm = (infop->info).perm + 1;
            if (tmp._3_1_ == 0x20) {
              (infop->info).filetype = CURLFILETYPE_NAMEDPIPE;
              *(undefined1 *)
               (*(long *)(i + 0x68) + *(long *)&(infop->info).gid + (ulong)(infop->info).perm + -4)
                   = 0;
              (infop->info).size = *(curl_off_t *)&(infop->info).gid;
              (infop->info).perm = 0;
              *(undefined8 *)&(infop->info).gid = 0;
            }
            else {
              if ((tmp._3_1_ == 0xd) || (tmp._3_1_ == 10)) {
                PL_ERROR((connectdata *)tmpdata,CURLE_FTP_BAD_FILE_LIST);
                return (size_t)conn;
              }
              (infop->info).filetype = CURLFILETYPE_DIRECTORY;
            }
            break;
          case CURLFILETYPE_NAMEDPIPE:
            if ((tmp._3_1_ == 0xd) || (tmp._3_1_ == 10)) {
              PL_ERROR((connectdata *)tmpdata,CURLE_FTP_BAD_FILE_LIST);
              return (size_t)conn;
            }
            (infop->info).filetype = CURLFILETYPE_SOCKET;
            *(long *)&(infop->info).gid = *(long *)(i + 0x78) + -1;
            (infop->info).perm = 1;
            break;
          case CURLFILETYPE_SOCKET:
            (infop->info).perm = (infop->info).perm + 1;
            if (tmp._3_1_ == 0xd) {
              (infop->info).filetype = CURLFILETYPE_DOOR;
            }
            else if (tmp._3_1_ == 10) {
              *(undefined1 *)
               (*(long *)(i + 0x68) + *(long *)&(infop->info).gid + (ulong)(infop->info).perm + -1)
                   = 0;
              (infop->info).strings.group = *(char **)&(infop->info).gid;
              tmp._4_4_ = ftp_pl_insert_finfo((connectdata *)tmpdata,(fileinfo *)finfo);
              if (tmp._4_4_ != CURLE_OK) {
                PL_ERROR((connectdata *)tmpdata,tmp._4_4_);
                return (size_t)conn;
              }
              *(undefined4 *)((long)&(infop->info).filename + 4) = 1;
              tmp._4_4_ = 0;
            }
            break;
          case CURLFILETYPE_DOOR:
            if (tmp._3_1_ != 10) {
              PL_ERROR((connectdata *)tmpdata,CURLE_FTP_BAD_FILE_LIST);
              return (size_t)conn;
            }
            *(undefined1 *)
             (*(long *)(i + 0x68) + *(long *)&(infop->info).gid + (ulong)(infop->info).perm + -1) =
                 0;
            (infop->info).strings.group = *(char **)&(infop->info).gid;
            tmp._4_4_ = ftp_pl_insert_finfo((connectdata *)tmpdata,(fileinfo *)finfo);
            if (tmp._4_4_ != CURLE_OK) {
              PL_ERROR((connectdata *)tmpdata,tmp._4_4_);
              return (size_t)conn;
            }
            *(undefined4 *)((long)&(infop->info).filename + 4) = 1;
            tmp._4_4_ = 0;
          }
        }
      }
      else {
        if (iVar4 != 2) {
          return (size_t)(undefined1 *)((long)&conn->data + 1);
        }
        switch(*(undefined4 *)((long)&(infop->info).filename + 4)) {
        case 0:
          (infop->info).perm = (infop->info).perm + 1;
          if ((infop->info).perm < 9) {
            pcVar8 = strchr("0123456789-",(int)(char)tmp._3_1_);
            if (pcVar8 == (char *)0x0) {
              PL_ERROR((connectdata *)tmpdata,CURLE_FTP_BAD_FILE_LIST);
              return (size_t)conn;
            }
          }
          else {
            if ((infop->info).perm != 9) {
              PL_ERROR((connectdata *)tmpdata,CURLE_FTP_BAD_FILE_LIST);
              return (size_t)conn;
            }
            if (tmp._3_1_ != 0x20) {
              PL_ERROR((connectdata *)tmpdata,CURLE_FTP_BAD_FILE_LIST);
              return (size_t)conn;
            }
            *(undefined4 *)((long)&(infop->info).filename + 4) = 1;
            (infop->info).filetype = CURLFILETYPE_FILE;
          }
          break;
        case 1:
          (infop->info).perm = (infop->info).perm + 1;
          cVar1 = (infop->info).filetype;
          if (cVar1 == CURLFILETYPE_FILE) {
            ppuVar7 = __ctype_b_loc();
            if (((*ppuVar7)[(int)(uint)tmp._3_1_] & 0x2000) == 0) {
              (infop->info).filetype = CURLFILETYPE_DIRECTORY;
            }
          }
          else if (cVar1 == CURLFILETYPE_DIRECTORY) {
            if (tmp._3_1_ == 0x20) {
              (infop->info).strings.perm = *(char **)&(infop->info).gid;
              *(undefined1 *)
               (*(long *)(i + 0x68) + *(long *)&(infop->info).gid + (ulong)(infop->info).perm + -1)
                   = 0;
              *(undefined4 *)((long)&(infop->info).filename + 4) = 2;
              (infop->info).filetype = CURLFILETYPE_FILE;
              (infop->info).perm = 0;
            }
            else {
              pcVar8 = strchr("APM0123456789:",(int)(char)tmp._3_1_);
              if (pcVar8 == (char *)0x0) {
                PL_ERROR((connectdata *)tmpdata,CURLE_FTP_BAD_FILE_LIST);
                return (size_t)conn;
              }
            }
          }
          break;
        case 2:
          cVar1 = (infop->info).filetype;
          if (cVar1 == CURLFILETYPE_FILE) {
            if (tmp._3_1_ != 0x20) {
              *(long *)&(infop->info).gid = *(long *)(i + 0x78) + -1;
              (infop->info).perm = 1;
              (infop->info).filetype = CURLFILETYPE_DIRECTORY;
            }
          }
          else if ((cVar1 == CURLFILETYPE_DIRECTORY) &&
                  ((infop->info).perm = (infop->info).perm + 1, tmp._3_1_ == 0x20)) {
            *(undefined1 *)
             (*(long *)(i + 0x68) + *(long *)&(infop->info).gid + (ulong)(infop->info).perm + -1) =
                 0;
            iVar4 = strcmp("<DIR>",(char *)(*(long *)(i + 0x68) + *(long *)&(infop->info).gid));
            if (iVar4 == 0) {
              *(undefined4 *)(i + 8) = 1;
              *(undefined8 *)(i + 0x28) = 0;
            }
            else {
              lVar9 = strtol((char *)(*(long *)(i + 0x68) + *(long *)&(infop->info).gid),&local_b0,
                             10);
              *(long *)(i + 0x28) = lVar9;
              if (*local_b0 != '\0') {
                PL_ERROR((connectdata *)tmpdata,CURLE_FTP_BAD_FILE_LIST);
                return (size_t)conn;
              }
              if (((*(long *)(i + 0x28) == 0x7fffffffffffffff) ||
                  (*(long *)(i + 0x28) == -0x8000000000000000)) &&
                 (piVar10 = __errno_location(), *piVar10 == 0x22)) {
                PL_ERROR((connectdata *)tmpdata,CURLE_FTP_BAD_FILE_LIST);
                return (size_t)conn;
              }
              *(undefined4 *)((infop->info).time + 8) = 0;
            }
            lVar9 = (infop->info).time;
            *(uint *)(lVar9 + 0x60) = *(uint *)(lVar9 + 0x60) | 0x40;
            (infop->info).perm = 0;
            *(undefined4 *)((long)&(infop->info).filename + 4) = 3;
            (infop->info).filetype = CURLFILETYPE_FILE;
          }
          break;
        case 3:
          cVar1 = (infop->info).filetype;
          if (cVar1 == CURLFILETYPE_FILE) {
            if (tmp._3_1_ != 0x20) {
              *(long *)&(infop->info).gid = *(long *)(i + 0x78) + -1;
              (infop->info).perm = 1;
              (infop->info).filetype = CURLFILETYPE_DIRECTORY;
            }
          }
          else if (cVar1 == CURLFILETYPE_DIRECTORY) {
            (infop->info).perm = (infop->info).perm + 1;
            if (tmp._3_1_ == 0xd) {
              (infop->info).filetype = CURLFILETYPE_SYMLINK;
              *(undefined1 *)(*(long *)(i + 0x68) + *(long *)(i + 0x78) + -1) = 0;
            }
            else if (tmp._3_1_ == 10) {
              (infop->info).size = *(curl_off_t *)&(infop->info).gid;
              *(undefined1 *)(*(long *)(i + 0x68) + *(long *)(i + 0x78) + -1) = 0;
              (infop->info).size = *(curl_off_t *)&(infop->info).gid;
              tmp._4_4_ = ftp_pl_insert_finfo((connectdata *)tmpdata,(fileinfo *)finfo);
              if (tmp._4_4_ != CURLE_OK) {
                PL_ERROR((connectdata *)tmpdata,tmp._4_4_);
                return (size_t)conn;
              }
              *(undefined4 *)((long)&(infop->info).filename + 4) = 0;
              (infop->info).filetype = CURLFILETYPE_FILE;
              tmp._4_4_ = 0;
            }
          }
          else if (cVar1 == CURLFILETYPE_SYMLINK) {
            if (tmp._3_1_ != 10) {
              PL_ERROR((connectdata *)tmpdata,CURLE_FTP_BAD_FILE_LIST);
              return (size_t)conn;
            }
            (infop->info).size = *(curl_off_t *)&(infop->info).gid;
            tmp._4_4_ = ftp_pl_insert_finfo((connectdata *)tmpdata,(fileinfo *)finfo);
            if (tmp._4_4_ != CURLE_OK) {
              PL_ERROR((connectdata *)tmpdata,tmp._4_4_);
              return (size_t)conn;
            }
            *(undefined4 *)((long)&(infop->info).filename + 4) = 0;
            (infop->info).filetype = CURLFILETYPE_FILE;
            tmp._4_4_ = 0;
          }
        }
      }
    }
    buffer_local = (char *)conn;
  }
  return (size_t)buffer_local;
}

Assistant:

size_t Curl_ftp_parselist(char *buffer, size_t size, size_t nmemb,
                          void *connptr)
{
  size_t bufflen = size*nmemb;
  struct connectdata *conn = (struct connectdata *)connptr;
  struct ftp_wc_tmpdata *tmpdata = conn->data->wildcard.tmp;
  struct ftp_parselist_data *parser = tmpdata->parser;
  struct fileinfo *infop;
  struct curl_fileinfo *finfo;
  unsigned long i = 0;
  CURLcode result;

  if(parser->error) { /* error in previous call */
    /* scenario:
     * 1. call => OK..
     * 2. call => OUT_OF_MEMORY (or other error)
     * 3. (last) call => is skipped RIGHT HERE and the error is hadled later
     *    in wc_statemach()
     */
    return bufflen;
  }

  if(parser->os_type == OS_TYPE_UNKNOWN && bufflen > 0) {
    /* considering info about FILE response format */
    parser->os_type = (buffer[0] >= '0' && buffer[0] <= '9') ?
                       OS_TYPE_WIN_NT : OS_TYPE_UNIX;
  }

  while(i < bufflen) { /* FSM */

    char c = buffer[i];
    if(!parser->file_data) { /* tmp file data is not allocated yet */
      parser->file_data = Curl_fileinfo_alloc();
      if(!parser->file_data) {
        parser->error = CURLE_OUT_OF_MEMORY;
        return bufflen;
      }
      parser->file_data->info.b_data = malloc(FTP_BUFFER_ALLOCSIZE);
      if(!parser->file_data->info.b_data) {
        PL_ERROR(conn, CURLE_OUT_OF_MEMORY);
        return bufflen;
      }
      parser->file_data->info.b_size = FTP_BUFFER_ALLOCSIZE;
      parser->item_offset = 0;
      parser->item_length = 0;
    }

    infop = parser->file_data;
    finfo = &infop->info;
    finfo->b_data[finfo->b_used++] = c;

    if(finfo->b_used >= finfo->b_size - 1) {
      /* if it is important, extend buffer space for file data */
      char *tmp = realloc(finfo->b_data,
                          finfo->b_size + FTP_BUFFER_ALLOCSIZE);
      if(tmp) {
        finfo->b_size += FTP_BUFFER_ALLOCSIZE;
        finfo->b_data = tmp;
      }
      else {
        Curl_fileinfo_dtor(NULL, parser->file_data);
        parser->file_data = NULL;
        parser->error = CURLE_OUT_OF_MEMORY;
        PL_ERROR(conn, CURLE_OUT_OF_MEMORY);
        return bufflen;
      }
    }

    switch(parser->os_type) {
    case OS_TYPE_UNIX:
      switch(parser->state.UNIX.main) {
      case PL_UNIX_TOTALSIZE:
        switch(parser->state.UNIX.sub.total_dirsize) {
        case PL_UNIX_TOTALSIZE_INIT:
          if(c == 't') {
            parser->state.UNIX.sub.total_dirsize = PL_UNIX_TOTALSIZE_READING;
            parser->item_length++;
          }
          else {
            parser->state.UNIX.main = PL_UNIX_FILETYPE;
            /* start FSM again not considering size of directory */
            finfo->b_used = 0;
            i--;
          }
          break;
        case PL_UNIX_TOTALSIZE_READING:
          parser->item_length++;
          if(c == '\r') {
            parser->item_length--;
            finfo->b_used--;
          }
          else if(c == '\n') {
            finfo->b_data[parser->item_length - 1] = 0;
            if(strncmp("total ", finfo->b_data, 6) == 0) {
              char *endptr = finfo->b_data+6;
              /* here we can deal with directory size, pass the leading white
                 spaces and then the digits */
              while(ISSPACE(*endptr))
                endptr++;
              while(ISDIGIT(*endptr))
                endptr++;
              if(*endptr != 0) {
                PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
                return bufflen;
              }
              parser->state.UNIX.main = PL_UNIX_FILETYPE;
              finfo->b_used = 0;
            }
            else {
              PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
              return bufflen;
            }
          }
          break;
        }
        break;
      case PL_UNIX_FILETYPE:
        switch(c) {
        case '-':
          finfo->filetype = CURLFILETYPE_FILE;
          break;
        case 'd':
          finfo->filetype = CURLFILETYPE_DIRECTORY;
          break;
        case 'l':
          finfo->filetype = CURLFILETYPE_SYMLINK;
          break;
        case 'p':
          finfo->filetype = CURLFILETYPE_NAMEDPIPE;
          break;
        case 's':
          finfo->filetype = CURLFILETYPE_SOCKET;
          break;
        case 'c':
          finfo->filetype = CURLFILETYPE_DEVICE_CHAR;
          break;
        case 'b':
          finfo->filetype = CURLFILETYPE_DEVICE_BLOCK;
          break;
        case 'D':
          finfo->filetype = CURLFILETYPE_DOOR;
          break;
        default:
          PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
          return bufflen;
        }
        parser->state.UNIX.main = PL_UNIX_PERMISSION;
        parser->item_length = 0;
        parser->item_offset = 1;
        break;
      case PL_UNIX_PERMISSION:
        parser->item_length++;
        if(parser->item_length <= 9) {
          if(!strchr("rwx-tTsS", c)) {
            PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
            return bufflen;
          }
        }
        else if(parser->item_length == 10) {
          unsigned int perm;
          if(c != ' ') {
            PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
            return bufflen;
          }
          finfo->b_data[10] = 0; /* terminate permissions */
          perm = ftp_pl_get_permission(finfo->b_data + parser->item_offset);
          if(perm & FTP_LP_MALFORMATED_PERM) {
            PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
            return bufflen;
          }
          parser->file_data->info.flags |= CURLFINFOFLAG_KNOWN_PERM;
          parser->file_data->info.perm = perm;
          parser->offsets.perm = parser->item_offset;

          parser->item_length = 0;
          parser->state.UNIX.main = PL_UNIX_HLINKS;
          parser->state.UNIX.sub.hlinks = PL_UNIX_HLINKS_PRESPACE;
        }
        break;
      case PL_UNIX_HLINKS:
        switch(parser->state.UNIX.sub.hlinks) {
        case PL_UNIX_HLINKS_PRESPACE:
          if(c != ' ') {
            if(c >= '0' && c <= '9') {
              parser->item_offset = finfo->b_used - 1;
              parser->item_length = 1;
              parser->state.UNIX.sub.hlinks = PL_UNIX_HLINKS_NUMBER;
            }
            else {
              PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
              return bufflen;
            }
          }
          break;
        case PL_UNIX_HLINKS_NUMBER:
          parser->item_length ++;
          if(c == ' ') {
            char *p;
            long int hlinks;
            finfo->b_data[parser->item_offset + parser->item_length - 1] = 0;
            hlinks = strtol(finfo->b_data + parser->item_offset, &p, 10);
            if(p[0] == '\0' && hlinks != LONG_MAX && hlinks != LONG_MIN) {
              parser->file_data->info.flags |= CURLFINFOFLAG_KNOWN_HLINKCOUNT;
              parser->file_data->info.hardlinks = hlinks;
            }
            parser->item_length = 0;
            parser->item_offset = 0;
            parser->state.UNIX.main = PL_UNIX_USER;
            parser->state.UNIX.sub.user = PL_UNIX_USER_PRESPACE;
          }
          else if(c < '0' || c > '9') {
            PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
            return bufflen;
          }
          break;
        }
        break;
      case PL_UNIX_USER:
        switch(parser->state.UNIX.sub.user) {
        case PL_UNIX_USER_PRESPACE:
          if(c != ' ') {
            parser->item_offset = finfo->b_used - 1;
            parser->item_length = 1;
            parser->state.UNIX.sub.user = PL_UNIX_USER_PARSING;
          }
          break;
        case PL_UNIX_USER_PARSING:
          parser->item_length++;
          if(c == ' ') {
            finfo->b_data[parser->item_offset + parser->item_length - 1] = 0;
            parser->offsets.user = parser->item_offset;
            parser->state.UNIX.main = PL_UNIX_GROUP;
            parser->state.UNIX.sub.group = PL_UNIX_GROUP_PRESPACE;
            parser->item_offset = 0;
            parser->item_length = 0;
          }
          break;
        }
        break;
      case PL_UNIX_GROUP:
        switch(parser->state.UNIX.sub.group) {
        case PL_UNIX_GROUP_PRESPACE:
          if(c != ' ') {
            parser->item_offset = finfo->b_used - 1;
            parser->item_length = 1;
            parser->state.UNIX.sub.group = PL_UNIX_GROUP_NAME;
          }
          break;
        case PL_UNIX_GROUP_NAME:
          parser->item_length++;
          if(c == ' ') {
            finfo->b_data[parser->item_offset + parser->item_length - 1] = 0;
            parser->offsets.group = parser->item_offset;
            parser->state.UNIX.main = PL_UNIX_SIZE;
            parser->state.UNIX.sub.size = PL_UNIX_SIZE_PRESPACE;
            parser->item_offset = 0;
            parser->item_length = 0;
          }
          break;
        }
        break;
      case PL_UNIX_SIZE:
        switch(parser->state.UNIX.sub.size) {
        case PL_UNIX_SIZE_PRESPACE:
          if(c != ' ') {
            if(c >= '0' && c <= '9') {
              parser->item_offset = finfo->b_used - 1;
              parser->item_length = 1;
              parser->state.UNIX.sub.size = PL_UNIX_SIZE_NUMBER;
            }
            else {
              PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
              return bufflen;
            }
          }
          break;
        case PL_UNIX_SIZE_NUMBER:
          parser->item_length++;
          if(c == ' ') {
            char *p;
            curl_off_t fsize;
            finfo->b_data[parser->item_offset + parser->item_length - 1] = 0;
            fsize = curlx_strtoofft(finfo->b_data+parser->item_offset, &p, 10);
            if(p[0] == '\0' && fsize != CURL_OFF_T_MAX &&
                               fsize != CURL_OFF_T_MIN) {
              parser->file_data->info.flags |= CURLFINFOFLAG_KNOWN_SIZE;
              parser->file_data->info.size = fsize;
            }
            parser->item_length = 0;
            parser->item_offset = 0;
            parser->state.UNIX.main = PL_UNIX_TIME;
            parser->state.UNIX.sub.time = PL_UNIX_TIME_PREPART1;
          }
          else if(!ISDIGIT(c)) {
            PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
            return bufflen;
          }
          break;
        }
        break;
      case PL_UNIX_TIME:
        switch(parser->state.UNIX.sub.time) {
        case PL_UNIX_TIME_PREPART1:
          if(c != ' ') {
            if(ISALNUM(c)) {
              parser->item_offset = finfo->b_used -1;
              parser->item_length = 1;
              parser->state.UNIX.sub.time = PL_UNIX_TIME_PART1;
            }
            else {
              PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
              return bufflen;
            }
          }
          break;
        case PL_UNIX_TIME_PART1:
          parser->item_length++;
          if(c == ' ') {
            parser->state.UNIX.sub.time = PL_UNIX_TIME_PREPART2;
          }
          else if(!ISALNUM(c) && c != '.') {
            PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
            return bufflen;
          }
          break;
        case PL_UNIX_TIME_PREPART2:
          parser->item_length++;
          if(c != ' ') {
            if(ISALNUM(c)) {
              parser->state.UNIX.sub.time = PL_UNIX_TIME_PART2;
            }
            else {
              PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
              return bufflen;
            }
          }
          break;
        case PL_UNIX_TIME_PART2:
          parser->item_length++;
          if(c == ' ') {
            parser->state.UNIX.sub.time = PL_UNIX_TIME_PREPART3;
          }
          else if(!ISALNUM(c) && c != '.') {
            PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
            return bufflen;
          }
          break;
        case PL_UNIX_TIME_PREPART3:
          parser->item_length++;
          if(c != ' ') {
            if(ISALNUM(c)) {
              parser->state.UNIX.sub.time = PL_UNIX_TIME_PART3;
            }
            else {
              PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
              return bufflen;
            }
          }
          break;
        case PL_UNIX_TIME_PART3:
          parser->item_length++;
          if(c == ' ') {
            finfo->b_data[parser->item_offset + parser->item_length -1] = 0;
            parser->offsets.time = parser->item_offset;
            /*
              if(ftp_pl_gettime(parser, finfo->b_data + parser->item_offset)) {
                parser->file_data->flags |= CURLFINFOFLAG_KNOWN_TIME;
              }
            */
            if(finfo->filetype == CURLFILETYPE_SYMLINK) {
              parser->state.UNIX.main = PL_UNIX_SYMLINK;
              parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_PRESPACE;
            }
            else {
              parser->state.UNIX.main = PL_UNIX_FILENAME;
              parser->state.UNIX.sub.filename = PL_UNIX_FILENAME_PRESPACE;
            }
          }
          else if(!ISALNUM(c) && c != '.' && c != ':') {
            PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
            return bufflen;
          }
          break;
        }
        break;
      case PL_UNIX_FILENAME:
        switch(parser->state.UNIX.sub.filename) {
        case PL_UNIX_FILENAME_PRESPACE:
          if(c != ' ') {
            parser->item_offset = finfo->b_used - 1;
            parser->item_length = 1;
            parser->state.UNIX.sub.filename = PL_UNIX_FILENAME_NAME;
          }
          break;
        case PL_UNIX_FILENAME_NAME:
          parser->item_length++;
          if(c == '\r') {
            parser->state.UNIX.sub.filename = PL_UNIX_FILENAME_WINDOWSEOL;
          }
          else if(c == '\n') {
            finfo->b_data[parser->item_offset + parser->item_length - 1] = 0;
            parser->offsets.filename = parser->item_offset;
            parser->state.UNIX.main = PL_UNIX_FILETYPE;
            result = ftp_pl_insert_finfo(conn, infop);
            if(result) {
              PL_ERROR(conn, result);
              return bufflen;
            }
          }
          break;
        case PL_UNIX_FILENAME_WINDOWSEOL:
          if(c == '\n') {
            finfo->b_data[parser->item_offset + parser->item_length - 1] = 0;
            parser->offsets.filename = parser->item_offset;
            parser->state.UNIX.main = PL_UNIX_FILETYPE;
            result = ftp_pl_insert_finfo(conn, infop);
            if(result) {
              PL_ERROR(conn, result);
              return bufflen;
            }
          }
          else {
            PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
            return bufflen;
          }
          break;
        }
        break;
      case PL_UNIX_SYMLINK:
        switch(parser->state.UNIX.sub.symlink) {
        case PL_UNIX_SYMLINK_PRESPACE:
          if(c != ' ') {
            parser->item_offset = finfo->b_used - 1;
            parser->item_length = 1;
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_NAME;
          }
          break;
        case PL_UNIX_SYMLINK_NAME:
          parser->item_length++;
          if(c == ' ') {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_PRETARGET1;
          }
          else if(c == '\r' || c == '\n') {
            PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
            return bufflen;
          }
          break;
        case PL_UNIX_SYMLINK_PRETARGET1:
          parser->item_length++;
          if(c == '-') {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_PRETARGET2;
          }
          else if(c == '\r' || c == '\n') {
            PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
            return bufflen;
          }
          else {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_NAME;
          }
          break;
        case PL_UNIX_SYMLINK_PRETARGET2:
          parser->item_length++;
          if(c == '>') {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_PRETARGET3;
          }
          else if(c == '\r' || c == '\n') {
            PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
            return bufflen;
          }
          else {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_NAME;
          }
          break;
        case PL_UNIX_SYMLINK_PRETARGET3:
          parser->item_length++;
          if(c == ' ') {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_PRETARGET4;
            /* now place where is symlink following */
            finfo->b_data[parser->item_offset + parser->item_length - 4] = 0;
            parser->offsets.filename = parser->item_offset;
            parser->item_length = 0;
            parser->item_offset = 0;
          }
          else if(c == '\r' || c == '\n') {
            PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
            return bufflen;
          }
          else {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_NAME;
          }
          break;
        case PL_UNIX_SYMLINK_PRETARGET4:
          if(c != '\r' && c != '\n') {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_TARGET;
            parser->item_offset = finfo->b_used - 1;
            parser->item_length = 1;
          }
          else {
            PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
            return bufflen;
          }
          break;
        case PL_UNIX_SYMLINK_TARGET:
          parser->item_length++;
          if(c == '\r') {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_WINDOWSEOL;
          }
          else if(c == '\n') {
            finfo->b_data[parser->item_offset + parser->item_length - 1] = 0;
            parser->offsets.symlink_target = parser->item_offset;
            result = ftp_pl_insert_finfo(conn, infop);
            if(result) {
              PL_ERROR(conn, result);
              return bufflen;
            }
            parser->state.UNIX.main = PL_UNIX_FILETYPE;
          }
          break;
        case PL_UNIX_SYMLINK_WINDOWSEOL:
          if(c == '\n') {
            finfo->b_data[parser->item_offset + parser->item_length - 1] = 0;
            parser->offsets.symlink_target = parser->item_offset;
            result = ftp_pl_insert_finfo(conn, infop);
            if(result) {
              PL_ERROR(conn, result);
              return bufflen;
            }
            parser->state.UNIX.main = PL_UNIX_FILETYPE;
          }
          else {
            PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
            return bufflen;
          }
          break;
        }
        break;
      }
      break;
    case OS_TYPE_WIN_NT:
      switch(parser->state.NT.main) {
      case PL_WINNT_DATE:
        parser->item_length++;
        if(parser->item_length < 9) {
          if(!strchr("0123456789-", c)) { /* only simple control */
            PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
            return bufflen;
          }
        }
        else if(parser->item_length == 9) {
          if(c == ' ') {
            parser->state.NT.main = PL_WINNT_TIME;
            parser->state.NT.sub.time = PL_WINNT_TIME_PRESPACE;
          }
          else {
            PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
            return bufflen;
          }
        }
        else {
          PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
          return bufflen;
        }
        break;
      case PL_WINNT_TIME:
        parser->item_length++;
        switch(parser->state.NT.sub.time) {
        case PL_WINNT_TIME_PRESPACE:
          if(!ISSPACE(c)) {
            parser->state.NT.sub.time = PL_WINNT_TIME_TIME;
          }
          break;
        case PL_WINNT_TIME_TIME:
          if(c == ' ') {
            parser->offsets.time = parser->item_offset;
            finfo->b_data[parser->item_offset + parser->item_length -1] = 0;
            parser->state.NT.main = PL_WINNT_DIRORSIZE;
            parser->state.NT.sub.dirorsize = PL_WINNT_DIRORSIZE_PRESPACE;
            parser->item_length = 0;
          }
          else if(!strchr("APM0123456789:", c)) {
            PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
            return bufflen;
          }
          break;
        }
        break;
      case PL_WINNT_DIRORSIZE:
        switch(parser->state.NT.sub.dirorsize) {
        case PL_WINNT_DIRORSIZE_PRESPACE:
          if(c == ' ') {

          }
          else {
            parser->item_offset = finfo->b_used - 1;
            parser->item_length = 1;
            parser->state.NT.sub.dirorsize = PL_WINNT_DIRORSIZE_CONTENT;
          }
          break;
        case PL_WINNT_DIRORSIZE_CONTENT:
          parser->item_length ++;
          if(c == ' ') {
            finfo->b_data[parser->item_offset + parser->item_length - 1] = 0;
            if(strcmp("<DIR>", finfo->b_data + parser->item_offset) == 0) {
              finfo->filetype = CURLFILETYPE_DIRECTORY;
              finfo->size = 0;
            }
            else {
              char *endptr;
              finfo->size = curlx_strtoofft(finfo->b_data +
                                            parser->item_offset,
                                            &endptr, 10);
              if(!*endptr) {
                if(finfo->size == CURL_OFF_T_MAX ||
                   finfo->size == CURL_OFF_T_MIN) {
                  if(errno == ERANGE) {
                    PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
                    return bufflen;
                  }
                }
              }
              else {
                PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
                return bufflen;
              }
              /* correct file type */
              parser->file_data->info.filetype = CURLFILETYPE_FILE;
            }

            parser->file_data->info.flags |= CURLFINFOFLAG_KNOWN_SIZE;
            parser->item_length = 0;
            parser->state.NT.main = PL_WINNT_FILENAME;
            parser->state.NT.sub.filename = PL_WINNT_FILENAME_PRESPACE;
          }
          break;
        }
        break;
      case PL_WINNT_FILENAME:
        switch(parser->state.NT.sub.filename) {
        case PL_WINNT_FILENAME_PRESPACE:
          if(c != ' ') {
            parser->item_offset = finfo->b_used -1;
            parser->item_length = 1;
            parser->state.NT.sub.filename = PL_WINNT_FILENAME_CONTENT;
          }
          break;
        case PL_WINNT_FILENAME_CONTENT:
          parser->item_length++;
          if(c == '\r') {
            parser->state.NT.sub.filename = PL_WINNT_FILENAME_WINEOL;
            finfo->b_data[finfo->b_used - 1] = 0;
          }
          else if(c == '\n') {
            parser->offsets.filename = parser->item_offset;
            finfo->b_data[finfo->b_used - 1] = 0;
            parser->offsets.filename = parser->item_offset;
            result = ftp_pl_insert_finfo(conn, infop);
            if(result) {
              PL_ERROR(conn, result);
              return bufflen;
            }
            parser->state.NT.main = PL_WINNT_DATE;
            parser->state.NT.sub.filename = PL_WINNT_FILENAME_PRESPACE;
          }
          break;
        case PL_WINNT_FILENAME_WINEOL:
          if(c == '\n') {
            parser->offsets.filename = parser->item_offset;
            result = ftp_pl_insert_finfo(conn, infop);
            if(result) {
              PL_ERROR(conn, result);
              return bufflen;
            }
            parser->state.NT.main = PL_WINNT_DATE;
            parser->state.NT.sub.filename = PL_WINNT_FILENAME_PRESPACE;
          }
          else {
            PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
            return bufflen;
          }
          break;
        }
        break;
      }
      break;
    default:
      return bufflen + 1;
    }

    i++;
  }

  return bufflen;
}